

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_path.c
# Opt level: O2

int do_open_via_path(char *dir,char *name,char *ext,char *dirresult,char **nameresult,uint size,
                    int bin,t_namelist *searchpath)

{
  char *ext_00;
  int iVar1;
  t_namelist *ptVar2;
  int *fdp;
  int local_3c;
  char *local_38;
  
  fdp = &local_3c;
  local_3c = -1;
  iVar1 = sys_open_absolute(name,ext,dirresult,nameresult,size,size,fdp);
  if (iVar1 != 0) {
    return local_3c;
  }
  iVar1 = sys_trytoopenone(dir,name,ext,dirresult,nameresult,size,(int)fdp);
  if (-1 < iVar1) {
    return iVar1;
  }
  ptVar2 = (t_namelist *)&(pd_maininstance.pd_stuff)->st_temppath;
  local_38 = ext;
  while (ext_00 = local_38, ptVar2 = ptVar2->nl_next, ptVar2 != (t_namelist *)0x0) {
    iVar1 = sys_trytoopenone(ptVar2->nl_string,name,local_38,dirresult,nameresult,size,(int)fdp);
    if (-1 < iVar1) {
      return iVar1;
    }
  }
  for (; searchpath != (t_namelist *)0x0; searchpath = searchpath->nl_next) {
    iVar1 = sys_trytoopenone(searchpath->nl_string,name,ext_00,dirresult,nameresult,size,(int)fdp);
    if (-1 < iVar1) {
      return iVar1;
    }
  }
  if (sys_usestdpath == 0) {
LAB_00170cfb:
    *dirresult = '\0';
    *nameresult = dirresult;
    iVar1 = -1;
  }
  else {
    ptVar2 = (t_namelist *)&(pd_maininstance.pd_stuff)->st_staticpath;
    do {
      ptVar2 = ptVar2->nl_next;
      if (ptVar2 == (t_namelist *)0x0) goto LAB_00170cfb;
      iVar1 = sys_trytoopenone(ptVar2->nl_string,name,ext_00,dirresult,nameresult,size,(int)fdp);
    } while (iVar1 < 0);
  }
  return iVar1;
}

Assistant:

static int do_open_via_path(const char *dir, const char *name,
    const char *ext, char *dirresult, char **nameresult, unsigned int size,
    int bin, t_namelist *searchpath)
{
    t_namelist *nl;
    int fd = -1;

        /* first check if "name" is absolute (and if so, try to open) */
    if (sys_open_absolute(name, ext, dirresult, nameresult, size, bin, &fd))
        return (fd);

        /* otherwise "name" is relative; try the directory "dir" first. */
    if ((fd = sys_trytoopenone(dir, name, ext,
        dirresult, nameresult, size, bin)) >= 0)
            return (fd);

        /* next go through the temp paths from the commandline */
    for (nl = STUFF->st_temppath; nl; nl = nl->nl_next)
        if ((fd = sys_trytoopenone(nl->nl_string, name, ext,
            dirresult, nameresult, size, bin)) >= 0)
                return (fd);
        /* next look in built-in paths like "extra" */
    for (nl = searchpath; nl; nl = nl->nl_next)
        if ((fd = sys_trytoopenone(nl->nl_string, name, ext,
            dirresult, nameresult, size, bin)) >= 0)
                return (fd);
        /* next look in built-in paths like "extra" */
    if (sys_usestdpath)
        for (nl = STUFF->st_staticpath; nl; nl = nl->nl_next)
            if ((fd = sys_trytoopenone(nl->nl_string, name, ext,
                dirresult, nameresult, size, bin)) >= 0)
                    return (fd);

    *dirresult = 0;
    *nameresult = dirresult;
    return (-1);
}